

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

size_t file_write(png_t *png,void *p,size_t size,size_t numel)

{
  uint uVar1;
  size_t in_RCX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t result;
  undefined8 local_28;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_28 = fwrite(in_RSI,in_RDX,in_RCX,*(FILE **)(in_RDI + 0x18));
  }
  else {
    uVar1 = (**(code **)(in_RDI + 0x10))(in_RSI,in_RDX,in_RCX,*(undefined8 *)(in_RDI + 0x18));
    local_28 = (ulong)uVar1;
  }
  return local_28;
}

Assistant:

static size_t file_write(png_t* png, void* p, size_t size, size_t numel)
{
	size_t result;

	if(png->write_fun)
	{
		result = png->write_fun(p, size, numel, png->user_pointer);
	}
	else
	{
		result = fwrite(p, size, numel, png->user_pointer);
	}

	return result;
}